

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

bool __thiscall
GF2::MP<137UL,_GF2::MOGrlex<137UL>_>::Geobucket<4UL>::PopLM(Geobucket<4UL> *this,MM<137UL> *lm)

{
  undefined1 *this_00;
  size_t *psVar1;
  _List_node_base *p_Var2;
  pointer pMVar3;
  void *pvVar4;
  int iVar5;
  pointer pMVar6;
  size_t pos;
  long lVar7;
  long lVar8;
  long lVar9;
  
  pMVar6 = (this->_buckets).
           super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->_buckets).
                super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 5;
  this_00 = &pMVar6->field_0x18;
  lVar9 = -1;
  do {
    while (lVar8 = lVar8 + -1,
          pMVar6[lVar8].super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
          super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>._M_impl._M_node._M_size
          == 0) {
LAB_00131205:
      if (lVar8 == 0) {
        if (lVar9 == -1) {
          return false;
        }
        pMVar6 = (this->_buckets).
                 super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = *(void **)&pMVar6[lVar9].
                            super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                            super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>;
        psVar1 = (size_t *)
                 ((long)&pMVar6[lVar9].super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                         super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> + 0x10);
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pvVar4,0x28);
        return true;
      }
      pMVar6 = (this->_buckets).
               super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if (lVar9 == -1) {
LAB_001311ea:
      p_Var2 = pMVar6[lVar8].super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
               super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>._M_impl._M_node.
               super__List_node_base._M_next;
      lVar7 = 0;
      do {
        (lm->super_WW<137UL>)._words[lVar7] = *(word *)((long)(p_Var2 + 1) + lVar7 * 8);
        lVar7 = lVar7 + 1;
        lVar9 = lVar8;
      } while (lVar7 != 3);
      goto LAB_00131205;
    }
    iVar5 = MOGrlex<137UL>::Compare
                      ((MOGrlex<137UL> *)this_00,
                       (MM<137UL> *)
                       (pMVar6[lVar8].super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                        super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>._M_impl.
                        _M_node.super__List_node_base._M_next + 1),lm);
    if (0 < iVar5) {
      pMVar6 = (this->_buckets).
               super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_001311ea;
    }
    if (iVar5 != 0) goto LAB_00131205;
    pMVar6 = (this->_buckets).
             super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = *(void **)&pMVar6[lVar9].super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                        super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>;
    psVar1 = (size_t *)
             ((long)&pMVar6[lVar9].super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                     super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> + 0x10);
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pvVar4,0x28);
    pMVar6 = (this->_buckets).
             super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = *(void **)&pMVar6[lVar8].super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                        super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>;
    psVar1 = (size_t *)
             ((long)&pMVar6[lVar8].super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                     super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> + 0x10);
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(pvVar4,0x28);
    pMVar6 = (this->_buckets).
             super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar3 = (this->_buckets).
             super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar8 = (long)pMVar3 - (long)pMVar6 >> 5;
    lVar9 = -1;
    if (pMVar3 == pMVar6) {
      return false;
    }
  } while( true );
}

Assistant:

bool PopLM(MM<_n>& lm)
		{
			int cmp;
			size_t i = SIZE_MAX, j = (size_t)_buckets.size();
			const _O& o = _buckets[0].GetOrder();
			do
			{
				// пропускаем пустые корзины
				if (_buckets[--j].IsEmpty())
					continue;
				// новый старший моном?
				if (i == SIZE_MAX || (cmp = o.Compare(_buckets[j].LM(), lm)) > 0)
					lm = _buckets[i = j].LM();
				// одинаковые мономы?
				else if (cmp == 0) 
				{
					// удаляем мономы из корзин и начинаем все сначала
					_buckets[i].PopLM(), _buckets[j].PopLM();
					i = SIZE_MAX, j = (size_t)_buckets.size();
				}
			}
			while (j != 0);
			// моногочлен ненулевой?
			if (i != SIZE_MAX) _buckets[i].PopLM();
			// признак успеха
			return i != SIZE_MAX;
		}